

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

optional<svg::Point> * svg::getMinPoint(vector<svg::Point,_std::allocator<svg::Point>_> *points)

{
  bool bVar1;
  const_reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  vector<svg::Point,_std::allocator<svg::Point>_> *in_RSI;
  optional<svg::Point> *in_RDI;
  uint i;
  Point min;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar5;
  Point local_18;
  vector<svg::Point,_std::allocator<svg::Point>_> *local_8;
  
  local_8 = in_RSI;
  bVar1 = std::vector<svg::Point,_std::allocator<svg::Point>_>::empty
                    ((vector<svg::Point,_std::allocator<svg::Point>_> *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar1) {
    optional<svg::Point>::optional((optional<svg::Point> *)0x11224d);
  }
  else {
    pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[](local_8,0);
    local_18.x = pvVar2->x;
    local_18.y = pvVar2->y;
    uVar5 = 0;
    while( true ) {
      uVar3 = (ulong)uVar5;
      sVar4 = std::vector<svg::Point,_std::allocator<svg::Point>_>::size(local_8);
      if (sVar4 <= uVar3) break;
      pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                         (local_8,(ulong)uVar5);
      if (pvVar2->x < local_18.x) {
        pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                           (local_8,(ulong)uVar5);
        local_18.x = pvVar2->x;
      }
      pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                         (local_8,(ulong)uVar5);
      if (pvVar2->y < local_18.y) {
        pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                           (local_8,(ulong)uVar5);
        local_18.y = pvVar2->y;
      }
      uVar5 = uVar5 + 1;
    }
    optional<svg::Point>::optional(in_RDI,&local_18);
  }
  return in_RDI;
}

Assistant:

inline optional<Point> getMinPoint(std::vector<Point> const & points)
    {
        if (points.empty())
            return optional<Point>();

        Point min = points[0];
        for (unsigned i = 0; i < points.size(); ++i) {
            if (points[i].x < min.x)
                min.x = points[i].x;
            if (points[i].y < min.y)
                min.y = points[i].y;
        }
        return optional<Point>(min);
    }